

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigRepr.c
# Opt level: O1

int Aig_ObjCheckTfi_rec(Aig_Man_t *p,Aig_Obj_t *pNode,Aig_Obj_t *pOld)

{
  int iVar1;
  Aig_Obj_t *pAVar2;
  
  while( true ) {
    pAVar2 = pNode;
    if ((pAVar2 == (Aig_Obj_t *)0x0) || ((*(uint *)&pAVar2->field_0x18 & 7) == 2)) {
      return 0;
    }
    if (pAVar2 == pOld) {
      return 1;
    }
    if (pAVar2->TravId == p->nTravIds) break;
    pAVar2->TravId = p->nTravIds;
    iVar1 = Aig_ObjCheckTfi_rec(p,(Aig_Obj_t *)((ulong)pAVar2->pFanin0 & 0xfffffffffffffffe),pOld);
    if (iVar1 != 0) {
      return 1;
    }
    iVar1 = Aig_ObjCheckTfi_rec(p,(Aig_Obj_t *)((ulong)pAVar2->pFanin1 & 0xfffffffffffffffe),pOld);
    if (iVar1 != 0) {
      return 1;
    }
    pNode = (Aig_Obj_t *)0x0;
    if (p->pEquivs != (Aig_Obj_t **)0x0) {
      pNode = p->pEquivs[pAVar2->Id];
    }
  }
  return 0;
}

Assistant:

int Aig_ObjCheckTfi_rec( Aig_Man_t * p, Aig_Obj_t * pNode, Aig_Obj_t * pOld )
{
    // check the trivial cases
    if ( pNode == NULL )
        return 0;
    if ( Aig_ObjIsCi(pNode) )
        return 0;
//    if ( pNode->Id < pOld->Id ) // cannot use because of choices of pNode
//        return 0;
    if ( pNode == pOld )
        return 1;
    // skip the visited node
    if ( Aig_ObjIsTravIdCurrent( p, pNode ) )
        return 0;
    Aig_ObjSetTravIdCurrent( p, pNode );
    // check the children
    if ( Aig_ObjCheckTfi_rec( p, Aig_ObjFanin0(pNode), pOld ) )
        return 1;
    if ( Aig_ObjCheckTfi_rec( p, Aig_ObjFanin1(pNode), pOld ) )
        return 1;
    // check equivalent nodes
    return Aig_ObjCheckTfi_rec( p, Aig_ObjEquiv(p, pNode), pOld );
}